

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_shift_l(mbedtls_mpi *X,size_t count)

{
  sbyte sVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  mbedtls_mpi_uint r1;
  mbedtls_mpi_uint r0;
  size_t t1;
  size_t v0;
  size_t i;
  int ret;
  size_t count_local;
  mbedtls_mpi *X_local;
  
  r1 = 0;
  uVar2 = count >> 6;
  sVar3 = mbedtls_mpi_bitlen(X);
  uVar4 = sVar3 + count;
  if ((uVar4 <= X->n << 6) ||
     (i._4_4_ = mbedtls_mpi_grow(X,(uVar4 >> 6) + (long)(int)(uint)((uVar4 & 0x3f) != 0)),
     i._4_4_ == 0)) {
    i._4_4_ = 0;
    if (uVar2 != 0) {
      for (v0 = X->n; uVar2 < v0; v0 = v0 - 1) {
        X->p[v0 - 1] = X->p[(v0 - uVar2) + -1];
      }
      for (; v0 != 0; v0 = v0 - 1) {
        X->p[v0 - 1] = 0;
      }
    }
    v0 = uVar2;
    if ((count & 0x3f) != 0) {
      for (; v0 < X->n; v0 = v0 + 1) {
        uVar2 = X->p[v0];
        sVar1 = (sbyte)(count & 0x3f);
        X->p[v0] = X->p[v0] << sVar1;
        X->p[v0] = r1 | X->p[v0];
        r1 = uVar2 >> (0x40U - sVar1 & 0x3f);
      }
    }
  }
  return i._4_4_;
}

Assistant:

int mbedtls_mpi_shift_l( mbedtls_mpi *X, size_t count )
{
    int ret;
    size_t i, v0, t1;
    mbedtls_mpi_uint r0 = 0, r1;

    v0 = count / (biL    );
    t1 = count & (biL - 1);

    i = mbedtls_mpi_bitlen( X ) + count;

    if( X->n * biL < i )
        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, BITS_TO_LIMBS( i ) ) );

    ret = 0;

    /*
     * shift by count / limb_size
     */
    if( v0 > 0 )
    {
        for( i = X->n; i > v0; i-- )
            X->p[i - 1] = X->p[i - v0 - 1];

        for( ; i > 0; i-- )
            X->p[i - 1] = 0;
    }

    /*
     * shift by count % limb_size
     */
    if( t1 > 0 )
    {
        for( i = v0; i < X->n; i++ )
        {
            r1 = X->p[i] >> (biL - t1);
            X->p[i] <<= t1;
            X->p[i] |= r0;
            r0 = r1;
        }
    }

cleanup:

    return( ret );
}